

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

S2Point * __thiscall
s2textformat::MakePointOrDie(S2Point *__return_storage_ptr__,s2textformat *this,string_view str)

{
  string_view str_00;
  bool bVar1;
  ostream *poVar2;
  absl *this_00;
  size_type sVar3;
  string_view piece;
  S2Point *point;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  s2textformat *local_28;
  char *local_20;
  s2textformat *psStack_18;
  string_view str_local;
  
  str_local.ptr_ = str.ptr_;
  psStack_18 = this;
  Vector3<double>::Vector3(__return_storage_ptr__);
  local_28 = psStack_18;
  local_20 = str_local.ptr_;
  str_00.length_ = (size_type)str_local.ptr_;
  str_00.ptr_ = (char *)psStack_18;
  bVar1 = MakePoint(str_00,__return_storage_ptr__);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return __return_storage_ptr__;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x60,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_40);
  poVar2 = std::operator<<(poVar2,"Check failed: MakePoint(str, &point) ");
  this_00 = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this_00,(ostream *)psStack_18,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(&local_29,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
}

Assistant:

S2Point MakePointOrDie(string_view str) {
  S2Point point;
  S2_CHECK(MakePoint(str, &point)) << ": str == \"" << str << "\"";
  return point;
}